

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O2

void __thiscall unodb::qsbr::reset_stats(qsbr *this)

{
  assert_idle(this);
  std::mutex::lock(&this->dealloc_stats_lock);
  (this->epoch_dealloc_per_thread_count_stats).accumulators.car.super_max_impl<unsigned_long>.max_ =
       0;
  (this->epoch_dealloc_per_thread_count_stats).accumulators.cdr.car.super_count_impl.cnt = 0;
  (this->epoch_dealloc_per_thread_count_stats).accumulators.cdr.cdr.car.
  super_immediate_mean_impl<unsigned_long,_boost::accumulators::tag::sample>.mean = 0.0;
  (this->epoch_dealloc_per_thread_count_stats).accumulators.cdr.cdr.cdr.car.
  super_variance_impl<unsigned_long,_boost::accumulators::tag::mean,_boost::accumulators::tag::sample>
  .variance = 0.0;
  (this->epoch_dealloc_per_thread_count_max).super___atomic_base<unsigned_long>._M_i = 0;
  (this->epoch_dealloc_per_thread_count_variance).super___atomic_float<double>._M_fp = 0.0;
  (this->deallocation_size_per_thread_stats).accumulators.car.super_max_impl<unsigned_long>.max_ = 0
  ;
  (this->deallocation_size_per_thread_stats).accumulators.cdr.car.super_count_impl.cnt = 0;
  (this->deallocation_size_per_thread_stats).accumulators.cdr.cdr.car.
  super_immediate_mean_impl<unsigned_long,_boost::accumulators::tag::sample>.mean = 0.0;
  (this->deallocation_size_per_thread_stats).accumulators.cdr.cdr.cdr.car.
  super_variance_impl<unsigned_long,_boost::accumulators::tag::mean,_boost::accumulators::tag::sample>
  .variance = 0.0;
  (this->deallocation_size_per_thread_max).super___atomic_base<unsigned_long>._M_i = 0;
  (this->deallocation_size_per_thread_mean).super___atomic_float<double>._M_fp = 0.0;
  (this->deallocation_size_per_thread_variance).super___atomic_float<double>._M_fp = 0.0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->dealloc_stats_lock);
  std::mutex::lock(&this->quiescent_state_stats_lock);
  (this->quiescent_states_per_thread_between_epoch_change_stats).accumulators.car.super_count_impl.
  cnt = 0;
  (this->quiescent_states_per_thread_between_epoch_change_stats).accumulators.cdr.car.
  super_sum_impl<unsigned_long,_boost::accumulators::tag::sample>.sum = 0;
  (this->quiescent_states_per_thread_between_epoch_change_mean).super___atomic_float<double>._M_fp =
       NAN;
  pthread_mutex_unlock((pthread_mutex_t *)&this->quiescent_state_stats_lock);
  return;
}

Assistant:

void qsbr::reset_stats() {
  // Stats can only be reset on idle QSBR - best-effort check as nothing
  // prevents to leaving idle state at any time
  assert_idle();

  {
    const std::lock_guard guard{dealloc_stats_lock};

    epoch_dealloc_per_thread_count_stats = {};
    publish_epoch_callback_stats();

    deallocation_size_per_thread_stats = {};
    publish_deallocation_size_stats();
  }

  {
    const std::lock_guard guard{quiescent_state_stats_lock};

    quiescent_states_per_thread_between_epoch_change_stats = {};
    publish_quiescent_states_per_thread_between_epoch_change_stats();
  }
}